

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_1::WatWriter::WriteTable(WatWriter *this,Table *table)

{
  string_view str;
  NextChar in_R8D;
  
  WritePuts(this,"(",None);
  WritePuts(this,"table",Space);
  this->indent_ = this->indent_ + 2;
  str.data_ = (table->name)._M_dataplus._M_p;
  str.size_ = (table->name)._M_string_length;
  WriteNameOrIndex(this,str,this->table_index_,in_R8D);
  WriteInlineExports(this,Table,this->table_index_);
  WriteInlineImport(this,Table,this->table_index_);
  WriteLimits(this,&table->elem_limits);
  WritePuts(this,"anyfunc",Space);
  WriteClose(this,Newline);
  this->table_index_ = this->table_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteTable(const Table& table) {
  WriteOpenSpace("table");
  WriteNameOrIndex(table.name, table_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Table, table_index_);
  WriteInlineImport(ExternalKind::Table, table_index_);
  WriteLimits(table.elem_limits);
  WritePutsSpace("anyfunc");
  WriteCloseNewline();
  table_index_++;
}